

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,Cord *output)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  LogMessage *pLVar5;
  size_type sVar6;
  undefined4 extraout_var_00;
  void **v1;
  void **v2;
  char *pcVar7;
  undefined4 extraout_var_01;
  Span<char> SVar8;
  LogMessage local_220;
  Voidify local_209;
  unsigned_long local_208;
  unsigned_long local_200;
  Nullable<const_char_*> local_1f8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  undefined1 local_1e0 [8];
  EpsCopyOutputStream out;
  Cord local_190;
  undefined1 local_180 [8];
  CordOutputStream output_stream;
  LogMessage local_140;
  Voidify local_129;
  unsigned_long local_128;
  unsigned_long local_120;
  Nullable<const_char_*> local_118;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  LogMessage local_100;
  Voidify local_e9;
  void *local_e8;
  Nullable<const_char_*> local_e0;
  Nullable<const_char_*> local_d8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  uint8_t *res;
  EpsCopyOutputStream out_1;
  uint8_t *target;
  Span<char> available;
  CordBuffer buffer;
  LogMessage local_48;
  Voidify local_31;
  unsigned_long local_30;
  size_t total_size;
  size_t size;
  Cord *output_local;
  MessageLite *this_local;
  
  size = (size_t)output;
  output_local = (Cord *)this;
  iVar3 = (*this->_vptr_MessageLite[3])();
  total_size = CONCAT44(extraout_var,iVar3);
  sVar4 = absl::lts_20250127::Cord::size((Cord *)size);
  local_30 = CONCAT44(extraout_var,iVar3) + sVar4;
  if (total_size < 0x80000000) {
    absl::lts_20250127::Cord::GetAppendBuffer((Cord *)&available.len_,size,total_size);
    SVar8 = absl::lts_20250127::CordBuffer::available((CordBuffer *)&available.len_);
    available.ptr_ = (pointer)SVar8.len_;
    target = (uint8_t *)SVar8.ptr_;
    out_1._56_8_ = absl::lts_20250127::Span<char>::data((Span<char> *)&target);
    sVar6 = absl::lts_20250127::Span<char>::size((Span<char> *)&target);
    uVar1 = out_1._56_8_;
    if (sVar6 < total_size) {
      sVar4 = absl::lts_20250127::CordBuffer::capacity((CordBuffer *)&available.len_);
      absl::lts_20250127::CordBuffer::SetLength((CordBuffer *)&available.len_,sVar4);
      absl::lts_20250127::Cord::Cord(&local_190,(Cord *)size);
      absl::lts_20250127::CordBuffer::CordBuffer
                ((CordBuffer *)&out.had_error_,(CordBuffer *)&available.len_);
      io::CordOutputStream::CordOutputStream
                ((CordOutputStream *)local_180,&local_190,(CordBuffer *)&out.had_error_,local_30);
      absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&out.had_error_);
      absl::lts_20250127::Cord::~Cord(&local_190);
      uVar1 = out_1._56_8_;
      sVar6 = absl::lts_20250127::Span<char>::size((Span<char> *)&target);
      bVar2 = io::CodedOutputStream::IsDefaultSerializationDeterministic();
      io::EpsCopyOutputStream::EpsCopyOutputStream
                ((EpsCopyOutputStream *)local_1e0,(void *)uVar1,(int)sVar6,
                 (ZeroCopyOutputStream *)local_180,bVar2,(uint8_t **)&out_1.had_error_);
      iVar3 = (*this->_vptr_MessageLite[5])(this,out_1._56_8_,local_1e0);
      out_1._56_8_ = CONCAT44(extraout_var_01,iVar3);
      io::EpsCopyOutputStream::Trim((EpsCopyOutputStream *)local_1e0,(uint8_t *)out_1._56_8_);
      bVar2 = io::EpsCopyOutputStream::HadError((EpsCopyOutputStream *)local_1e0);
      if (bVar2) {
        this_local._7_1_ = 0;
      }
      else {
        io::CordOutputStream::Consume((CordOutputStream *)&absl_log_internal_check_op_result);
        absl::lts_20250127::Cord::operator=((Cord *)size,(Cord *)&absl_log_internal_check_op_result)
        ;
        absl::lts_20250127::Cord::~Cord((Cord *)&absl_log_internal_check_op_result);
        sVar4 = absl::lts_20250127::Cord::size((Cord *)size);
        local_200 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar4);
        local_208 = absl::lts_20250127::log_internal::GetReferenceableValue(local_30);
        local_1f8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                              (&local_200,&local_208,"output->size() == total_size");
        if (local_1f8 != (Nullable<const_char_*>)0x0) {
          pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_1f8);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_220,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                     ,0x2ba,pcVar7);
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_220);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_209,pLVar5);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_220);
        }
        this_local._7_1_ = 1;
        local_1f8 = (Nullable<const_char_*>)0x0;
      }
      output_stream.buffer_.rep_.field_0._12_4_ = 1;
      io::CordOutputStream::~CordOutputStream((CordOutputStream *)local_180);
    }
    else {
      sVar6 = absl::lts_20250127::Span<char>::size((Span<char> *)&target);
      bVar2 = io::CodedOutputStream::IsDefaultSerializationDeterministic();
      io::EpsCopyOutputStream::EpsCopyOutputStream
                ((EpsCopyOutputStream *)&res,(void *)uVar1,(int)sVar6,bVar2);
      iVar3 = (*this->_vptr_MessageLite[5])(this,out_1._56_8_,&res);
      local_e0 = (Nullable<const_char_*>)CONCAT44(extraout_var_00,iVar3);
      absl_log_internal_check_op_result_1 = local_e0;
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue<void_const*>(&local_e0);
      local_e8 = (void *)(out_1._56_8_ + total_size);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue<void_const*>(&local_e8);
      local_d8 = absl::lts_20250127::log_internal::Check_EQImpl<void_const*,void_const*>
                           (v1,v2,
                            "static_cast<const void*>(res) == static_cast<const void*>(target + size)"
                           );
      if (local_d8 != (Nullable<const_char_*>)0x0) {
        pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_d8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x2a7,pcVar7);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_e9,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_100);
      }
      absl::lts_20250127::CordBuffer::IncreaseLengthBy((CordBuffer *)&available.len_,total_size);
      sVar4 = size;
      absl::lts_20250127::CordBuffer::CordBuffer
                ((CordBuffer *)&absl_log_internal_check_op_result_2,(CordBuffer *)&available.len_);
      absl::lts_20250127::Cord::Append
                ((Cord *)sVar4,(CordBuffer *)&absl_log_internal_check_op_result_2);
      absl::lts_20250127::CordBuffer::~CordBuffer
                ((CordBuffer *)&absl_log_internal_check_op_result_2);
      sVar4 = absl::lts_20250127::Cord::size((Cord *)size);
      local_120 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar4);
      local_128 = absl::lts_20250127::log_internal::GetReferenceableValue(local_30);
      local_118 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                            (&local_120,&local_128,"output->size() == total_size");
      if (local_118 != (Nullable<const_char_*>)0x0) {
        pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_118);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_140,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x2aa,pcVar7);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_140);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_129,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_140);
      }
      this_local._7_1_ = 1;
      output_stream.buffer_.rep_.field_0._12_4_ = 1;
      local_118 = (Nullable<const_char_*>)0x0;
    }
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&available.len_);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x296);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(char (*) [40])"Exceeded maximum protobuf size of 2GB: ");
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,total_size);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar5);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_48);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageLite::AppendPartialToString(absl::Cord* output) const {
  // For efficiency, we'd like to pass a size hint to CordOutputStream with
  // the exact total size expected.
  const size_t size = ByteSizeLong();
  const size_t total_size = size + output->size();
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }


  // Allocate a CordBuffer (which may utilize private capacity in 'output').
  absl::CordBuffer buffer = output->GetAppendBuffer(size);
  absl::Span<char> available = buffer.available();
  auto target = reinterpret_cast<uint8_t*>(available.data());
  if (available.size() >= size) {
    // Use EpsCopyOutputStream with full available capacity, as serialization
    // may in the future use the extra slop bytes if available.
    io::EpsCopyOutputStream out(
        target, static_cast<int>(available.size()),
        io::CodedOutputStream::IsDefaultSerializationDeterministic());
    auto res = _InternalSerialize(target, &out);
    ABSL_DCHECK_EQ(static_cast<const void*>(res),
                   static_cast<const void*>(target + size));
    buffer.IncreaseLengthBy(size);
    output->Append(std::move(buffer));
    ABSL_DCHECK_EQ(output->size(), total_size);
    return true;
  }

  // Donate the buffer to the CordOutputStream with length := capacity.
  // This follows the eager `EpsCopyOutputStream` initialization logic.
  buffer.SetLength(buffer.capacity());
  io::CordOutputStream output_stream(std::move(*output), std::move(buffer),
                                     total_size);
  io::EpsCopyOutputStream out(
      target, static_cast<int>(available.size()), &output_stream,
      io::CodedOutputStream::IsDefaultSerializationDeterministic(), &target);
  target = _InternalSerialize(target, &out);
  out.Trim(target);
  if (out.HadError()) return false;
  *output = output_stream.Consume();
  ABSL_DCHECK_EQ(output->size(), total_size);
  return true;
}